

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcontext_p.h
# Opt level: O1

QOpenGLFunctionsPrivateEx * __thiscall
QOpenGLMultiGroupSharedResource::value<QOpenGLFunctionsPrivateEx>
          (QOpenGLMultiGroupSharedResource *this,QOpenGLContext *context)

{
  Data<QHashPrivate::Node<QOpenGLMultiGroupSharedResource*,QOpenGLSharedResource*>> *this_00;
  QOpenGLContextGroup *pQVar1;
  Node<QOpenGLMultiGroupSharedResource_*,_QOpenGLSharedResource_*> *pNVar2;
  QOpenGLSharedResource **ppQVar3;
  QOpenGLFunctionsPrivateEx *this_01;
  long in_FS_OFFSET;
  QDeadlineTimer QVar4;
  QOpenGLMultiGroupSharedResource *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QOpenGLContext::shareGroup(context);
  QVar4.t2 = 0xffffffff;
  QVar4.type = 0x7fffffff;
  QVar4.t1 = (qint64)&this->m_mutex;
  QRecursiveMutex::tryLock(QVar4);
  this_00 = *(Data<QHashPrivate::Node<QOpenGLMultiGroupSharedResource*,QOpenGLSharedResource*>> **)
             (*(long *)&pQVar1->field_0x8 + 0xb0);
  local_30 = this;
  if (this_00 !=
      (Data<QHashPrivate::Node<QOpenGLMultiGroupSharedResource*,QOpenGLSharedResource*>> *)0x0) {
    pNVar2 = QHashPrivate::
             Data<QHashPrivate::Node<QOpenGLMultiGroupSharedResource*,QOpenGLSharedResource*>>::
             findNode<QOpenGLMultiGroupSharedResource*>(this_00,&local_30);
    if (pNVar2 != (Node<QOpenGLMultiGroupSharedResource_*,_QOpenGLSharedResource_*> *)0x0) {
      ppQVar3 = &pNVar2->value;
      goto LAB_0056b0a3;
    }
  }
  ppQVar3 = (QOpenGLSharedResource **)0x0;
LAB_0056b0a3:
  if (ppQVar3 == (QOpenGLSharedResource **)0x0) {
    this_01 = (QOpenGLFunctionsPrivateEx *)0x0;
  }
  else {
    this_01 = (QOpenGLFunctionsPrivateEx *)*ppQVar3;
  }
  if (this_01 == (QOpenGLFunctionsPrivateEx *)0x0) {
    this_01 = (QOpenGLFunctionsPrivateEx *)operator_new(0xb78);
    QOpenGLFunctionsPrivateEx::QOpenGLFunctionsPrivateEx(this_01,context);
    insert(this,context,(QOpenGLSharedResource *)this_01);
  }
  QRecursiveMutex::unlock();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

T *value(QOpenGLContext *context) {
        QOpenGLContextGroup *group = context->shareGroup();
        // Have to use our own mutex here, not the group's, since
        // m_groups has to be protected too against any concurrent access.
        QMutexLocker locker(&m_mutex);
        T *resource = static_cast<T *>(group->d_func()->m_resources.value(this, nullptr));
        if (!resource) {
            resource = new T(context);
            insert(context, resource);
        }
        return resource;
    }